

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O1

void helper_gvec_udot_idx_h_arm(void *vd,void *vn,void *vm,uint32_t desc)

{
  long *plVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  
  uVar10 = desc * 8 & 0xff;
  uVar6 = uVar10 + 8;
  uVar8 = (ulong)uVar6;
  iVar11 = (int)desc >> 10;
  uVar12 = 0;
  do {
    uVar7 = (ulong)*(ushort *)((long)vm + uVar12 * 8 + (long)iVar11 * 8);
    uVar14 = (ulong)*(ushort *)((long)vm + uVar12 * 8 + (long)iVar11 * 8 + 2);
    uVar13 = (ulong)*(ushort *)((long)vm + uVar12 * 8 + (long)iVar11 * 8 + 4);
    uVar9 = (ulong)*(ushort *)((long)vm + uVar12 * 8 + (long)iVar11 * 8 + 6);
    uVar2 = *(ushort *)((long)vn + uVar12 * 8 + 8);
    uVar3 = *(ushort *)((long)vn + uVar12 * 8 + 10);
    uVar4 = *(ushort *)((long)vn + uVar12 * 8 + 0xc);
    uVar5 = *(ushort *)((long)vn + uVar12 * 8 + 0xe);
    plVar1 = (long *)((long)vd + uVar12 * 8);
    *plVar1 = *plVar1 + *(ushort *)((long)vn + uVar12 * 8 + 6) * uVar9 +
                        *(ushort *)((long)vn + uVar12 * 8 + 4) * uVar13 +
                        *(ushort *)((long)vn + uVar12 * 8 + 2) * uVar14 +
                        *(ushort *)((long)vn + uVar12 * 8) * uVar7;
    plVar1 = (long *)((long)vd + uVar12 * 8 + 8);
    *plVar1 = *plVar1 + uVar5 * uVar9 + uVar4 * uVar13 + uVar3 * uVar14 + uVar2 * uVar7;
    uVar12 = uVar12 + 2;
  } while (uVar12 < uVar6 >> 3);
  uVar6 = desc >> 2 & 0xf8;
  if (uVar10 < uVar6) {
    uVar7 = (ulong)(uVar6 + 8);
    uVar12 = uVar8 + 8;
    if (uVar8 + 8 < uVar7) {
      uVar12 = uVar7;
    }
    memset((void *)((long)vd + uVar8),0,(~uVar8 + uVar12 & 0xfffffffffffffff8) + 8);
    return;
  }
  return;
}

Assistant:

void HELPER(gvec_udot_idx_h)(void *vd, void *vn, void *vm, uint32_t desc)
{
    intptr_t i, opr_sz = simd_oprsz(desc), opr_sz_8 = opr_sz / 8;
    intptr_t index = simd_data(desc);
    uint64_t *d = vd;
    uint16_t *n = vn;
    uint16_t *m_indexed = (uint16_t *)vm + index * 4;

    /* This is supported by SVE only, so opr_sz is always a multiple of 16.
     * Process the entire segment all at once, writing back the results
     * only after we've consumed all of the inputs.
     */
    for (i = 0; i < opr_sz_8 ; i += 2) {
        uint64_t d0, d1;

        d0  = n[i * 4 + 0] * (uint64_t)m_indexed[i * 4 + 0];
        d0 += n[i * 4 + 1] * (uint64_t)m_indexed[i * 4 + 1];
        d0 += n[i * 4 + 2] * (uint64_t)m_indexed[i * 4 + 2];
        d0 += n[i * 4 + 3] * (uint64_t)m_indexed[i * 4 + 3];
        d1  = n[i * 4 + 4] * (uint64_t)m_indexed[i * 4 + 0];
        d1 += n[i * 4 + 5] * (uint64_t)m_indexed[i * 4 + 1];
        d1 += n[i * 4 + 6] * (uint64_t)m_indexed[i * 4 + 2];
        d1 += n[i * 4 + 7] * (uint64_t)m_indexed[i * 4 + 3];

        d[i + 0] += d0;
        d[i + 1] += d1;
    }

    clear_tail(d, opr_sz, simd_maxsz(desc));
}